

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Group.c
# Opt level: O1

Llb_Grp_t * Llb_ManGroupCreateLast(Llb_Man_t *pMan)

{
  void *pvVar1;
  Vec_Ptr_t *pVVar2;
  Llb_Grp_t *pLVar3;
  Aig_Man_t *pAVar4;
  void **ppvVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  
  pLVar3 = Llb_ManGroupAlloc(pMan);
  pAVar4 = pMan->pAig;
  if (0 < pAVar4->nRegs) {
    iVar7 = 0;
    do {
      uVar6 = pAVar4->nTruePos + iVar7;
      if (((int)uVar6 < 0) || (pAVar4->vCos->nSize <= (int)uVar6)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar1 = pAVar4->vCos->pArray[uVar6];
      pVVar2 = pLVar3->vIns;
      uVar6 = pVVar2->nCap;
      if (pVVar2->nSize == uVar6) {
        if ((int)uVar6 < 0x10) {
          if (pVVar2->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar2->pArray,0x80);
          }
          pVVar2->pArray = ppvVar5;
          iVar8 = 0x10;
        }
        else {
          iVar8 = uVar6 * 2;
          if (iVar8 <= (int)uVar6) goto LAB_009241e3;
          if (pVVar2->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar6 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar2->pArray,(ulong)uVar6 << 4);
          }
          pVVar2->pArray = ppvVar5;
        }
        pVVar2->nCap = iVar8;
      }
LAB_009241e3:
      iVar8 = pVVar2->nSize;
      pVVar2->nSize = iVar8 + 1;
      pVVar2->pArray[iVar8] = pvVar1;
      iVar7 = iVar7 + 1;
      pAVar4 = pMan->pAig;
    } while (iVar7 < pAVar4->nRegs);
  }
  return pLVar3;
}

Assistant:

Llb_Grp_t * Llb_ManGroupCreateLast( Llb_Man_t * pMan )
{
    Llb_Grp_t * p;
    Aig_Obj_t * pObj;
    int i;
    p = Llb_ManGroupAlloc( pMan );
    Saig_ManForEachLi( pMan->pAig, pObj, i )
        Vec_PtrPush( p->vIns, pObj );
    return p;
}